

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstate.c
# Opt level: O0

lua_State * lua_newthread(lua_State *L)

{
  global_State *g_00;
  StkId pSVar1;
  lua_State *L_00;
  lua_State *x_;
  TValue *io;
  lua_State *L1;
  GCObject *o;
  global_State *g;
  lua_State *L_local;
  
  g_00 = L->l_G;
  if (L->l_G->GCdebt < 1) {
    luaC_step(L);
  }
  L_00 = (lua_State *)luaC_newobjdt(L,'\b',0xd8,8);
  pSVar1 = (L->top).p;
  *(lua_State **)pSVar1 = L_00;
  (pSVar1->val).tt_ = 'H';
  (L->top).p = (StkId)((L->top).offset + 0x10);
  preinit_thread(L_00,g_00);
  L_00->hookmask = L->hookmask;
  L_00->basehookcount = L->basehookcount;
  L_00->hook = L->hook;
  L_00->hookcount = L_00->basehookcount;
  L_00[-1].transferinfo = *(anon_struct_8_2_9c65610d_for_transferinfo *)(g_00->mainth).extra_;
  stack_init(L_00,L);
  return L_00;
}

Assistant:

LUA_API lua_State *lua_newthread (lua_State *L) {
  global_State *g = G(L);
  GCObject *o;
  lua_State *L1;
  lua_lock(L);
  luaC_checkGC(L);
  /* create new thread */
  o = luaC_newobjdt(L, LUA_TTHREAD, sizeof(LX), offsetof(LX, l));
  L1 = gco2th(o);
  /* anchor it on L stack */
  setthvalue2s(L, L->top.p, L1);
  api_incr_top(L);
  preinit_thread(L1, g);
  L1->hookmask = L->hookmask;
  L1->basehookcount = L->basehookcount;
  L1->hook = L->hook;
  resethookcount(L1);
  /* initialize L1 extra space */
  memcpy(lua_getextraspace(L1), lua_getextraspace(mainthread(g)),
         LUA_EXTRASPACE);
  luai_userstatethread(L, L1);
  stack_init(L1, L);  /* init stack */
  lua_unlock(L);
  return L1;
}